

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O1

char * bson_iter_codewscope(bson_iter_t *iter,uint32_t *length,uint32_t *scope_len,uint8_t **scope)

{
  size_t *psVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  double dVar5;
  int64_t iVar6;
  _Bool _Var7;
  uint uVar8;
  int iVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  char *pcVar12;
  size_t sVar13;
  ulong uVar14;
  code *pcVar15;
  bson_oid_t *pbVar16;
  char *__s;
  size_t nbytes;
  ulong uVar17;
  void *pvVar18;
  uint32_t uVar19;
  undefined8 uVar20;
  int32_t iVar21;
  ulong *extraout_RDX;
  undefined4 *extraout_RDX_00;
  undefined8 extraout_RDX_01;
  bson_error_t *error;
  size_t __n;
  bson_json_destroy_cb p_Var22;
  anon_union_24_17_78d57918_for_value *dst;
  long lVar23;
  bson_json_reader_cb num_bytes;
  bson_error_t *__s_00;
  bson_t *pbVar24;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  bson_error_t bStack_460;
  uint32_t uStack_1a0;
  _Bool _Stack_199;
  bson_t *pbStack_198;
  uint32_t uStack_190;
  uint32_t uStack_18c;
  uint8_t *puStack_188;
  char *apcStack_180 [35];
  
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_codewscope_cold_2();
  }
  else {
    puVar10 = iter->raw;
    if (puVar10[iter->type] != '\x0f') {
      if (length != (uint32_t *)0x0) {
        *length = 0;
      }
      if (scope_len != (uint32_t *)0x0) {
        *scope_len = 0;
      }
      if (scope != (uint8_t **)0x0) {
        *scope = (uint8_t *)0x0;
      }
      return (char *)0x0;
    }
    if (length == (uint32_t *)0x0) {
LAB_001113bb:
      *scope_len = *(uint32_t *)(puVar10 + iter->d4);
      *scope = puVar10 + iter->d4;
      return (char *)(iter->raw + iter->d3);
    }
    if (*(int *)(puVar10 + iter->d2) != 0) {
      *length = *(int *)(puVar10 + iter->d2) - 1;
      goto LAB_001113bb;
    }
  }
  bson_iter_codewscope_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (extraout_RDX != (ulong *)0x0) {
      *extraout_RDX = 0;
    }
    if (scope != (uint8_t **)0x0) {
      *scope = (uint8_t *)0x0;
    }
    puVar10 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar10[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\f') {
      if ((bson_t *)length != (bson_t *)0x0) {
        uVar8 = *(uint *)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        puVar10 = (uint8_t *)(ulong)uVar8;
        ((bson_t *)length)->flags = uVar8;
        if (uVar8 != 0) {
          puVar10 = (uint8_t *)(ulong)(uVar8 - 1);
          ((bson_t *)length)->flags = uVar8 - 1;
        }
      }
      if (extraout_RDX != (ulong *)0x0) {
        puVar10 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
        *extraout_RDX = (ulong)puVar10;
      }
      if (scope != (uint8_t **)0x0) {
        puVar10 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
        *scope = puVar10;
      }
    }
    return (char *)puVar10;
  }
  bson_iter_dbpointer_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar10 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar10[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x0e') {
      puVar11 = puVar10 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar9 = 1;
      if (1 < *(int *)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar9 = *(int *)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar19 = iVar9 - 1;
    }
    else {
      puVar11 = (uint8_t *)0x0;
      uVar19 = 0;
    }
    if ((bson_t *)length != (bson_t *)0x0) {
      ((bson_t *)length)->flags = uVar19;
    }
    return (char *)puVar11;
  }
  bson_iter_symbol_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar10 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar10[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return (char *)0x0;
    }
    return *(char **)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
  }
  bson_iter_date_time_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar10 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar10[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return (char *)0x0;
    }
    return (char *)(*(ulong *)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) /
                   1000);
  }
  bson_iter_time_t_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar10 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar19 = 0;
    pcVar12 = (char *)0x0;
    if (puVar10[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x11') {
      pcVar12 = *(char **)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      uVar19 = (uint32_t)((ulong)pcVar12 >> 0x20);
    }
    if ((bson_t *)length != (bson_t *)0x0) {
      ((bson_t *)length)->flags = uVar19;
    }
    if (extraout_RDX_00 != (undefined4 *)0x0) {
      *extraout_RDX_00 = (int)pcVar12;
    }
    return pcVar12;
  }
  bson_iter_timestamp_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar10 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar10[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      ((bson_t *)length)->flags = 0;
      ((bson_t *)length)->len = 0;
      ((bson_t *)length)->padding[0] = '\0';
      ((bson_t *)length)->padding[1] = '\0';
      ((bson_t *)length)->padding[2] = '\0';
      ((bson_t *)length)->padding[3] = '\0';
      ((bson_t *)length)->padding[4] = '\0';
      ((bson_t *)length)->padding[5] = '\0';
      ((bson_t *)length)->padding[6] = '\0';
      ((bson_t *)length)->padding[7] = '\0';
      return (char *)puVar10;
    }
    lVar23 = *(long *)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    *(long *)length = lVar23 / 1000;
    pcVar12 = (char *)((lVar23 % 1000) * 1000);
    *(char **)((bson_t *)length)->padding = pcVar12;
    return pcVar12;
  }
  bson_iter_timeval_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_visit_all_cold_2();
  }
  else if ((bson_t *)length != (bson_t *)0x0) {
    _Var7 = _bson_iter_next_internal(iter,(char **)&puStack_188,&uStack_190,&_Stack_199);
    if (_Var7) {
      do {
        puVar10 = puStack_188;
        if (*puStack_188 != '\0') {
          sVar13 = strlen((char *)puStack_188);
          _Var7 = bson_utf8_validate((char *)puVar10,sVar13,false);
          if (!_Var7) {
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            break;
          }
        }
        if ((*(code **)length != (code *)0x0) &&
           (uVar14 = (**(code **)length)(iter,puVar10,extraout_RDX_01), (char)uVar14 != '\0'))
        goto LAB_00111b92;
        switch(uStack_190) {
        case 1:
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x10);
          if (pcVar15 == (code *)0x0) break;
          dVar5 = bson_iter_double(iter);
          uVar14 = (*pcVar15)(SUB84(dVar5,0),iter,puVar10,extraout_RDX_01);
          goto LAB_00111ad6;
        case 2:
          pcVar12 = bson_iter_utf8(iter,(uint32_t *)apcStack_180);
          _Var7 = bson_utf8_validate(pcVar12,(ulong)apcStack_180[0] & 0xffffffff,true);
          if (!_Var7) {
LAB_00111b8c:
            uVar8 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            uVar14 = (ulong)uVar8;
            *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) = uVar8;
            goto LAB_00111b92;
          }
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x18);
          goto LAB_001119f8;
        case 3:
          pbStack_198 = (bson_t *)0x0;
          uStack_1a0 = 0;
          bson_iter_document(iter,&uStack_1a0,(uint8_t **)&pbStack_198);
          _Var7 = bson_init_static((bson_t *)apcStack_180,(uint8_t *)pbStack_198,(ulong)uStack_1a0);
          if (_Var7) {
            pcVar15 = *(code **)(((bson_t *)length)->padding + 0x20);
            goto LAB_00111a42;
          }
          break;
        case 4:
          pbStack_198 = (bson_t *)0x0;
          uStack_1a0 = 0;
          bson_iter_array(iter,&uStack_1a0,(uint8_t **)&pbStack_198);
          _Var7 = bson_init_static((bson_t *)apcStack_180,(uint8_t *)pbStack_198,(ulong)uStack_1a0);
          if (_Var7) {
            pcVar15 = *(code **)(((bson_t *)length)->padding + 0x28);
            goto LAB_00111a42;
          }
          break;
        case 5:
          apcStack_180[0] = (char *)0x0;
          pbStack_198 = (bson_t *)((ulong)pbStack_198 & 0xffffffff00000000);
          uStack_1a0 = 0;
          bson_iter_binary(iter,(bson_subtype_t *)&pbStack_198,&uStack_1a0,(uint8_t **)apcStack_180)
          ;
          if (*(code **)(((bson_t *)length)->padding + 0x30) != (code *)0x0) {
            uVar14 = (**(code **)(((bson_t *)length)->padding + 0x30))
                               (iter,puVar10,(ulong)pbStack_198 & 0xffffffff,uStack_1a0,
                                apcStack_180[0],extraout_RDX_01);
            goto LAB_00111ad6;
          }
          break;
        case 6:
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x38);
          goto LAB_001119ae;
        case 7:
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x40);
          if (pcVar15 != (code *)0x0) {
            pbVar16 = bson_iter_oid(iter);
LAB_00111ac7:
            uVar14 = (*pcVar15)(iter,puVar10,pbVar16,extraout_RDX_01);
            goto LAB_00111ad6;
          }
          break;
        case 8:
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x48);
          if (pcVar15 != (code *)0x0) {
            _Var7 = bson_iter_bool(iter);
            uVar8 = (uint)_Var7;
LAB_00111934:
            uVar14 = (*pcVar15)(iter,puVar10,uVar8,extraout_RDX_01);
            goto LAB_00111ad6;
          }
          break;
        case 9:
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x50);
          if (pcVar15 != (code *)0x0) {
            pbVar16 = (bson_oid_t *)bson_iter_date_time(iter);
            goto LAB_00111ac7;
          }
          break;
        case 10:
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x58);
LAB_001119ae:
          if (pcVar15 == (code *)0x0) break;
LAB_001119bd:
          uVar14 = (*pcVar15)(iter,puVar10,extraout_RDX_01);
          goto LAB_00111ad6;
        case 0xb:
          apcStack_180[0] = (char *)0x0;
          __s = bson_iter_regex(iter,apcStack_180);
          sVar13 = strlen(__s);
          _Var7 = bson_utf8_validate(__s,sVar13,true);
          if (!_Var7) goto LAB_00111b8c;
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x60);
          pcVar12 = apcStack_180[0];
          if (pcVar15 == (code *)0x0) break;
          goto LAB_00111aaf;
        case 0xc:
          uStack_1a0 = 0;
          apcStack_180[0] = (char *)0x0;
          pbStack_198 = (bson_t *)0x0;
          bson_iter_dbpointer(iter,&uStack_1a0,apcStack_180,(bson_oid_t **)&pbStack_198);
          _Var7 = bson_utf8_validate(apcStack_180[0],(ulong)uStack_1a0,true);
          if (!_Var7) goto LAB_00111b8c;
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x68);
          pcVar12 = apcStack_180[0];
          pbVar24 = pbStack_198;
          if (pcVar15 != (code *)0x0) {
LAB_001117cc:
            uVar14 = (*pcVar15)(iter,puVar10,uStack_1a0,pcVar12,pbVar24,extraout_RDX_01);
            goto LAB_00111ad6;
          }
          break;
        case 0xd:
          pcVar12 = bson_iter_code(iter,(uint32_t *)apcStack_180);
          _Var7 = bson_utf8_validate(pcVar12,(ulong)apcStack_180[0] & 0xffffffff,true);
          if (!_Var7) goto LAB_00111b8c;
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x70);
          goto LAB_001119f8;
        case 0xe:
          pcVar12 = bson_iter_symbol(iter,(uint32_t *)apcStack_180);
          _Var7 = bson_utf8_validate(pcVar12,(ulong)apcStack_180[0] & 0xffffffff,true);
          if (!_Var7) goto LAB_00111b8c;
          pcVar15 = *(code **)((long)length + 0x80);
LAB_001119f8:
          if (pcVar15 != (code *)0x0) {
            __s = (char *)((ulong)apcStack_180[0] & 0xffffffff);
LAB_00111aaf:
            uVar14 = (*pcVar15)(iter,puVar10,__s,pcVar12,extraout_RDX_01);
LAB_00111ad6:
            if ((char)uVar14 != '\0') goto LAB_00111b92;
          }
          break;
        case 0xf:
          uStack_1a0 = 0;
          pbStack_198 = (bson_t *)0x0;
          uStack_18c = 0;
          pcVar12 = bson_iter_codewscope(iter,&uStack_1a0,&uStack_18c,(uint8_t **)&pbStack_198);
          _Var7 = bson_utf8_validate(pcVar12,(ulong)uStack_1a0,true);
          if (!_Var7) goto LAB_00111b8c;
          _Var7 = bson_init_static((bson_t *)apcStack_180,(uint8_t *)pbStack_198,(ulong)uStack_18c);
          if ((_Var7) &&
             (pcVar15 = *(code **)((bson_t *)((long)length + 0x80))->padding, pcVar15 != (code *)0x0
             )) {
            pbVar24 = (bson_t *)apcStack_180;
            goto LAB_001117cc;
          }
          break;
        case 0x10:
          pcVar15 = *(code **)(((bson_t *)((long)length + 0x80))->padding + 8);
          if (pcVar15 != (code *)0x0) {
            uVar8 = bson_iter_int32(iter);
            goto LAB_00111934;
          }
          break;
        case 0x11:
          bson_iter_timestamp(iter,(uint32_t *)apcStack_180,(uint32_t *)&pbStack_198);
          if (*(code **)(((bson_t *)((long)length + 0x80))->padding + 0x10) != (code *)0x0) {
            uVar14 = (**(code **)(((bson_t *)((long)length + 0x80))->padding + 0x10))
                               (iter,puVar10,(ulong)apcStack_180[0] & 0xffffffff,
                                (ulong)pbStack_198 & 0xffffffff,extraout_RDX_01);
            goto LAB_00111ad6;
          }
          break;
        case 0x12:
          pcVar15 = *(code **)(((bson_t *)((long)length + 0x80))->padding + 0x18);
          if (pcVar15 != (code *)0x0) {
            pbVar16 = (bson_oid_t *)bson_iter_int64(iter);
            goto LAB_00111ac7;
          }
          break;
        case 0x13:
          bson_iter_decimal128(iter,(bson_decimal128_t *)apcStack_180);
          pcVar15 = *(code **)(((bson_t *)((long)length + 0x80))->padding + 0x38);
LAB_00111a42:
          if (pcVar15 != (code *)0x0) {
            uVar14 = (*pcVar15)(iter,puVar10,(bson_t *)apcStack_180,extraout_RDX_01);
            goto LAB_00111ad6;
          }
          break;
        default:
          if (uStack_190 == 0x7f) {
            pcVar15 = *(code **)(((bson_t *)((long)length + 0x80))->padding + 0x20);
          }
          else {
            if (uStack_190 != 0xff) break;
            pcVar15 = *(code **)(((bson_t *)((long)length + 0x80))->padding + 0x28);
          }
          if (pcVar15 == (code *)0x0) break;
          puVar10 = (uint8_t *)
                    ((long)(((bson_json_reader_t *)iter)->producer).data +
                    (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4));
          goto LAB_001119bd;
        }
        if ((*(code **)((bson_t *)length)->padding != (code *)0x0) &&
           (uVar14 = (**(code **)((bson_t *)length)->padding)
                               (iter,(uint8_t *)
                                     ((long)(((bson_json_reader_t *)iter)->producer).data +
                                     (ulong)*(uint32_t *)
                                             ((long)&(((bson_json_reader_t *)iter)->producer).dcb +
                                             4)),extraout_RDX_01), (char)uVar14 != '\0')) {
LAB_00111b92:
          return (char *)CONCAT71((int7)(uVar14 >> 8),1);
        }
        _Var7 = _bson_iter_next_internal(iter,(char **)&puStack_188,&uStack_190,&_Stack_199);
      } while (_Var7);
    }
    if (*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) != 0) {
      if ((_Stack_199 == true) &&
         (*(long *)(((bson_t *)((long)length + 0x80))->padding + 0x30) != 0)) {
        sVar13 = strlen((char *)puStack_188);
        _Var7 = bson_utf8_validate((char *)puStack_188,sVar13,false);
        if (_Var7) {
          (**(code **)(((bson_t *)((long)length + 0x80))->padding + 0x30))
                    (iter,puStack_188,uStack_190,extraout_RDX_01);
          return (char *)0x0;
        }
      }
      if (*(code **)(((bson_t *)length)->padding + 8) != (code *)0x0) {
        (**(code **)(((bson_t *)length)->padding + 8))(iter,extraout_RDX_01);
      }
    }
    return (char *)0x0;
  }
  bson_iter_visit_all_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar10 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar10[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\b') {
      puVar10[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] = (uint8_t)length;
    }
    return (char *)puVar10;
  }
  bson_iter_overwrite_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar10 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar10[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      *(int *)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = (int)length;
    }
    return (char *)puVar10;
  }
  bson_iter_overwrite_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar10 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar10[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x12') {
      *(uint32_t **)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = length;
    }
    return (char *)puVar10;
  }
  bson_iter_overwrite_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar10 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar10[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x01') {
      *(ulong *)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) =
           CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    return (char *)puVar10;
  }
  bson_iter_overwrite_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar10 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar10[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x13') {
      uVar8 = *(uint *)&(((bson_json_reader_t *)iter)->producer).buf;
      lVar23 = *(long *)((bson_t *)length)->padding;
      *(long *)(puVar10 + uVar8) = *(long *)length;
      *(long *)((long)(puVar10 + uVar8) + 8) = lVar23;
    }
    return (char *)puVar10;
  }
  bson_iter_overwrite_decimal128_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_value_cold_1();
    if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
      bson_json_reader_read_cold_2();
    }
    else if ((bson_t *)length != (bson_t *)0x0) {
      (((bson_json_reader_t *)iter)->bson).bson = (bson_t *)length;
      (((bson_json_reader_t *)iter)->bson).n = -1;
      (((bson_json_reader_t *)iter)->bson).read_state = BSON_JSON_REGULAR;
      __s_00 = &bStack_460;
      if (error != (bson_error_t *)0x0) {
        __s_00 = error;
      }
      ((bson_json_reader_t *)iter)->error = __s_00;
      memset(__s_00,0,0x200);
      uVar8 = 0;
      while( true ) {
        sVar3 = ((bson_json_reader_t *)iter)->json->pos;
        nbytes = (((bson_json_reader_t *)iter)->producer).bytes_read;
        if (nbytes == 0) {
          nbytes = (*(((bson_json_reader_t *)iter)->producer).cb)
                             ((((bson_json_reader_t *)iter)->producer).data,
                              (((bson_json_reader_t *)iter)->producer).buf,
                              (((bson_json_reader_t *)iter)->producer).buf_size);
        }
        if ((long)nbytes < 0) {
          uVar8 = 0xffffffff;
          if (error != (bson_error_t *)0x0) {
            bson_set_error(error,1,3,"reader cb failed");
          }
          goto LAB_00111fff;
        }
        if (nbytes == 0) goto LAB_00111fff;
        (((bson_json_reader_t *)iter)->producer).bytes_read = nbytes;
        jsonsl_feed(((bson_json_reader_t *)iter)->json,
                    (jsonsl_char_t *)(((bson_json_reader_t *)iter)->producer).buf,nbytes);
        if (((bson_json_reader_t *)iter)->should_reset == true) {
          jsonsl_reset(((bson_json_reader_t *)iter)->json);
          ((bson_json_reader_t *)iter)->should_reset = false;
          puVar10 = (((bson_json_reader_t *)iter)->producer).buf;
          memmove(puVar10,puVar10 + ((bson_json_reader_t *)iter)->advance,
                  nbytes - ((bson_json_reader_t *)iter)->advance);
          psVar1 = &(((bson_json_reader_t *)iter)->producer).bytes_read;
          *psVar1 = *psVar1 - ((bson_json_reader_t *)iter)->advance;
          uVar8 = 1;
          goto LAB_00111fff;
        }
        if (((bson_json_reader_t *)iter)->error->domain != 0) break;
        uVar14 = ((bson_json_reader_t *)iter)->json_text_pos;
        if ((uVar14 != 0xffffffffffffffff) &&
           (uVar4 = ((bson_json_reader_t *)iter)->json->pos, uVar17 = uVar4 - uVar14,
           uVar14 <= uVar4 && uVar17 != 0)) {
          if (uVar17 < nbytes) {
            nbytes = uVar17;
          }
          lVar23 = uVar14 - sVar3;
          if (lVar23 < 1) {
            lVar23 = 0;
          }
          _bson_json_buf_append
                    (&((bson_json_reader_t *)iter)->tok_accumulator,
                     (((bson_json_reader_t *)iter)->producer).buf + lVar23,nbytes);
        }
        (((bson_json_reader_t *)iter)->producer).bytes_read = 0;
        uVar8 = 1;
      }
      uVar8 = 0xffffffff;
LAB_00111fff:
      if ((uVar8 == 1) && ((((bson_json_reader_t *)iter)->bson).read_state != BSON_JSON_DONE)) {
        _bson_json_read_corrupt((bson_json_reader_t *)iter,"%s","Incomplete JSON");
        uVar8 = 0xffffffff;
      }
      return (char *)(ulong)uVar8;
    }
    bson_json_reader_read_cold_1();
    p_Var22 = (((bson_json_reader_t *)iter)->producer).dcb;
    if (p_Var22 == (bson_json_destroy_cb)0x0) {
      _bson_json_buf_ensure((bson_json_buf_t *)iter,__n + 1);
    }
    else if ((((bson_json_reader_t *)iter)->producer).cb < p_Var22 + __n + 1) {
      uVar14 = (ulong)(p_Var22 + __n) >> 1 | (ulong)(p_Var22 + __n);
      uVar14 = uVar14 >> 2 | uVar14;
      uVar14 = uVar14 >> 4 | uVar14;
      uVar14 = uVar14 >> 8 | uVar14;
      uVar14 = uVar14 >> 0x10 | uVar14;
      num_bytes = (bson_json_reader_cb)((uVar14 >> 0x20 | uVar14) + 1);
      (((bson_json_reader_t *)iter)->producer).cb = num_bytes;
      pvVar18 = bson_realloc((((bson_json_reader_t *)iter)->producer).data,(size_t)num_bytes);
      (((bson_json_reader_t *)iter)->producer).data = pvVar18;
    }
    memcpy((((bson_json_reader_t *)iter)->producer).dcb +
           (long)(((bson_json_reader_t *)iter)->producer).data,length,__n);
    p_Var22 = (((bson_json_reader_t *)iter)->producer).dcb + __n;
    (((bson_json_reader_t *)iter)->producer).dcb = p_Var22;
    pcVar12 = (char *)(((bson_json_reader_t *)iter)->producer).data;
    pcVar12[(long)p_Var22] = '\0';
    return pcVar12;
  }
  puVar10 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
  uVar8 = *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb;
  bVar2 = puVar10[uVar8];
  ((bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed)->value_type = (uint)bVar2
  ;
  switch(bVar2) {
  case 1:
    dVar5 = bson_iter_double(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_double = dVar5;
    break;
  case 2:
    pcVar12 = bson_iter_utf8(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111e4c;
  case 3:
    bson_iter_document(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                       (uint8_t **)
                       &((anon_union_24_17_78d57918_for_value *)
                        &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 4:
    bson_iter_array(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                    (uint8_t **)
                    &((anon_union_24_17_78d57918_for_value *)
                     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 5:
    bson_iter_binary(iter,(bson_subtype_t *)&((bson_json_reader_t *)iter)->field_0x44,
                     (uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                     (uint8_t **)
                     &((anon_union_24_17_78d57918_for_value *)
                      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 6:
  case 10:
    break;
  case 7:
    pbVar16 = bson_iter_oid(iter);
    dst = (anon_union_24_17_78d57918_for_value *)
          &(((bson_json_reader_t *)iter)->producer).all_whitespace;
    goto LAB_00111da5;
  case 8:
    _Var7 = bson_iter_bool(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_bool = _Var7;
    break;
  case 9:
    pcVar12 = (char *)bson_iter_date_time(iter);
    goto LAB_00111e4c;
  case 0xb:
    pcVar12 = bson_iter_regex(iter,(char **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111e4c;
  case 0xc:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = 0;
    pbVar16 = (bson_oid_t *)0x0;
    if (puVar10[uVar8] == '\f') {
      uVar8 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar9 = *(int *)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + -1;
      if (*(int *)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) == 0) {
        iVar9 = 0;
      }
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar9;
      (((anon_union_24_17_78d57918_for_value *)
       &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str =
           (char *)(puVar10 + uVar8);
      pbVar16 = (bson_oid_t *)(puVar10 + (uint)(((bson_json_reader_t *)iter)->producer).buf_size);
    }
    dst = (anon_union_24_17_78d57918_for_value *)&((bson_json_reader_t *)iter)->field_0x44;
LAB_00111da5:
    bson_oid_copy(pbVar16,&dst->v_oid);
    break;
  case 0xd:
    if (puVar10[uVar8] == '\r') {
      iVar9 = 1;
      if (1 < *(int *)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar9 = *(int *)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar8 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar9 + -1;
      puVar11 = puVar10 + uVar8;
    }
    else {
      *(undefined4 *)&((bson_json_reader_t *)iter)->field_0x40 = 0;
      puVar11 = (uint8_t *)0x0;
    }
    goto LAB_00111e59;
  case 0xe:
    if (puVar10[uVar8] == '\x0e') {
      puVar11 = puVar10 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar9 = 1;
      if (1 < *(int *)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar9 = *(int *)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar9 = iVar9 + -1;
    }
    else {
      puVar11 = (uint8_t *)0x0;
      iVar9 = 0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar9;
LAB_00111e59:
    (((anon_union_24_17_78d57918_for_value *)
     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str = (char *)puVar11;
    break;
  case 0xf:
    pcVar12 = bson_iter_codewscope
                        (iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x48,
                         (uint32_t *)&((bson_json_reader_t *)iter)->field_0x4c,
                         (uint8_t **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111e4c;
  case 0x10:
    iVar21 = 0;
    if (puVar10[uVar8] == '\x10') {
      iVar21 = *(int32_t *)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar21;
    break;
  case 0x11:
    iVar21 = 0;
    uVar20 = 0;
    if (puVar10[uVar8] == '\x11') {
      uVar20 = *(undefined8 *)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      iVar21 = (int32_t)((ulong)uVar20 >> 0x20);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar21;
    *(int *)&(((bson_json_reader_t *)iter)->producer).field_0x3c = (int)uVar20;
    break;
  case 0x12:
    if (puVar10[uVar8] == '\x12') {
      pcVar12 = *(char **)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else {
      pcVar12 = (char *)0x0;
    }
LAB_00111e4c:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = (int64_t)pcVar12;
    break;
  case 0x13:
    if (puVar10[uVar8] == '\x13') {
      iVar6 = *(int64_t *)
               ((long)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + 8);
      ((anon_union_24_17_78d57918_for_value *)
      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64 =
           *(int64_t *)(puVar10 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *(int64_t *)&((bson_json_reader_t *)iter)->field_0x40 = iVar6;
    }
    break;
  default:
    if ((bVar2 != BSON_TYPE_MAXKEY) && (bVar2 != 0xff)) {
      return (char *)0x0;
    }
  }
  return (char *)(bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed;
}

Assistant:

const char *
bson_iter_codewscope (const bson_iter_t *iter, /* IN */
                      uint32_t *length,        /* OUT */
                      uint32_t *scope_len,     /* OUT */
                      const uint8_t **scope)   /* OUT */
{
   uint32_t len;

   BSON_ASSERT (iter);

   if (ITER_TYPE (iter) == BSON_TYPE_CODEWSCOPE) {
      if (length) {
         memcpy (&len, iter->raw + iter->d2, sizeof (len));
         /* The string length was checked > 0 in _bson_iter_next_internal. */
         len = BSON_UINT32_FROM_LE (len);
         BSON_ASSERT (len > 0);
         *length = len - 1;
      }

      memcpy (&len, iter->raw + iter->d4, sizeof (len));
      *scope_len = BSON_UINT32_FROM_LE (len);
      *scope = iter->raw + iter->d4;
      return (const char *) (iter->raw + iter->d3);
   }

   if (length) {
      *length = 0;
   }

   if (scope_len) {
      *scope_len = 0;
   }

   if (scope) {
      *scope = NULL;
   }

   return NULL;
}